

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

int AF_AActor_A_Log(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret
                   ,int numret)

{
  DObject *this;
  bool bVar1;
  char *pcVar2;
  FString text;
  FString formatted;
  FString local_28;
  FString local_20;
  
  if (numparam < 1) {
    pcVar2 = "(paramnum) < numparam";
  }
  else {
    if ((param->field_0).field_3.Type == '\x03') {
      this = (DObject *)(param->field_0).field_1.a;
      if ((param->field_0).field_1.atag == 1) {
        if (this != (DObject *)0x0) {
          bVar1 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
          if (!bVar1) {
            pcVar2 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
            goto LAB_003e369c;
          }
        }
LAB_003e3607:
        if (numparam == 1) {
          pcVar2 = "(paramnum) < numparam";
        }
        else {
          if (param[1].field_0.field_3.Type == '\x02') {
            FString::AttachToOther(&local_28,(FString *)(param + 1));
            if (*local_28.Chars == '$') {
              pcVar2 = FStringTable::operator()(&GStrings,local_28.Chars + 1);
              FString::operator=(&local_28,pcVar2);
            }
            strbin1((char *)&local_20);
            Printf("%s\n",local_20.Chars);
            FString::~FString(&local_20);
            FString::~FString(&local_28);
            return 0;
          }
          pcVar2 = "param[paramnum].Type == REGT_STRING";
        }
        __assert_fail(pcVar2,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0xc84,
                      "int AF_AActor_A_Log(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
      }
      if (this == (DObject *)0x0) goto LAB_003e3607;
    }
    pcVar2 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_003e369c:
  __assert_fail(pcVar2,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0xc83,"int AF_AActor_A_Log(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_Log)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_STRING(text);

	if (text[0] == '$') text = GStrings(&text[1]);
	FString formatted = strbin1(text);
	Printf("%s\n", formatted.GetChars());
	return 0;
}